

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

void * cab_read_ahead_cfdata_none(archive_read *a,ssize_t *avail)

{
  long lVar1;
  wchar_t wVar2;
  void *d;
  cfdata *cfdata;
  cab *cab;
  ssize_t *avail_local;
  archive_read *a_local;
  
  lVar1 = *(long *)((long)a->format->data + 0x38);
  a_local = (archive_read *)__archive_read_ahead(a,1,avail);
  if (*avail < 1) {
    wVar2 = truncated_error(a);
    *avail = (long)wVar2;
    a_local = (archive_read *)0x0;
  }
  else {
    if ((long)(ulong)*(ushort *)(lVar1 + 10) < *avail) {
      *avail = (ulong)*(ushort *)(lVar1 + 10);
    }
    *(undefined2 *)(lVar1 + 0xc) = *(undefined2 *)(lVar1 + 8);
    *(ssize_t *)(lVar1 + 0x10) = *avail;
    *(archive_read **)(lVar1 + 0x38) = a_local;
  }
  return a_local;
}

Assistant:

static const void *
cab_read_ahead_cfdata_none(struct archive_read *a, ssize_t *avail)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata;
	const void *d;

	cfdata = cab->entry_cfdata;

	/*
	 * Note: '1' here is a performance optimization.
	 * Recall that the decompression layer returns a count of
	 * available bytes; asking for more than that forces the
	 * decompressor to combine reads by copying data.
	 */
	d = __archive_read_ahead(a, 1, avail);
	if (*avail <= 0) {
		*avail = truncated_error(a);
		return (NULL);
	}
	if (*avail > cfdata->uncompressed_bytes_remaining)
		*avail = cfdata->uncompressed_bytes_remaining;
	cfdata->uncompressed_avail = cfdata->uncompressed_size;
	cfdata->unconsumed = *avail;
	cfdata->sum_ptr = d;
	return (d);
}